

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

void __thiscall Random_keys::geraPopAleatoria(Random_keys *this,Graph *g)

{
  RK_Individual *in_RAX;
  RK_Individual *this_00;
  int iVar1;
  RK_Individual *ind;
  
  ind = in_RAX;
  Graph::markOneDirectionInEdges(g);
  for (iVar1 = 0; iVar1 < this->tamPop; iVar1 = iVar1 + 1) {
    this_00 = (RK_Individual *)operator_new(0x28);
    RK_Individual::RK_Individual(this_00,g->edgesSize / 2 - g->numberOfNonModifiable);
    ind = this_00;
    RK_Individual::generate_random_weights(this_00);
    std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::push_back(&this->popAtual,&ind);
  }
  std::vector<RK_Individual_*,_std::allocator<RK_Individual_*>_>::operator=
            (&this->popAnterior,&this->popAtual);
  return;
}

Assistant:

void Random_keys::geraPopAleatoria(Graph *g){

    g->markOneDirectionInEdges();
    RK_Individual *ind;
    for(int i=0; i<this->tamPop; i++){

        ind = new RK_Individual(g->getEdgesSizes() / 2 - g->getNumberOfNonModifiable());
        ind->generate_random_weights();

        popAtual.push_back(ind);
    }
    popAnterior = popAtual;
}